

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environment.cpp
# Opt level: O3

void fix_rlimit(void)

{
  source_loc loc;
  source_loc loc_00;
  int iVar1;
  logger *this;
  char *msg;
  string_view_t fmt;
  rlimit limit;
  rlimit local_18;
  
  iVar1 = getrlimit(RLIMIT_NOFILE,&local_18);
  if (iVar1 == 0) {
    local_18.rlim_cur = local_18.rlim_max;
    iVar1 = setrlimit(RLIMIT_NOFILE,&local_18);
    this = spdlog::default_logger_raw();
    if (iVar1 == 0) {
      loc_00.funcname = (char *)0x0;
      loc_00.filename = (char *)0x0;
      loc_00.line = 0;
      loc_00._12_4_ = 0;
      fmt.size_ = 0x19;
      fmt.data_ = "RLIMIT_NOFILE updated: {}";
      spdlog::logger::log<unsigned_long>(this,loc_00,debug,fmt,&local_18.rlim_cur);
      return;
    }
    msg = "setrlimit() failed";
  }
  else {
    this = spdlog::default_logger_raw();
    msg = "getrlimit() failed";
  }
  loc.funcname = (char *)0x0;
  loc.filename = (char *)0x0;
  loc.line = 0;
  loc._12_4_ = 0;
  spdlog::logger::log<char[19],_nullptr>(this,loc,warn,(char (*) [19])msg);
  return;
}

Assistant:

void fix_rlimit() {
    struct rlimit limit;

    if (getrlimit(RLIMIT_NOFILE, &limit) != 0) {
        spdlog::warn("getrlimit() failed");
        return;
    }

    limit.rlim_cur = limit.rlim_max;
    if (setrlimit(RLIMIT_NOFILE, &limit) != 0) {
        spdlog::warn("setrlimit() failed");
        return;
    }

    spdlog::debug("RLIMIT_NOFILE updated: {}", limit.rlim_cur);
}